

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecodeEVEX(ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU8 *data)

{
  ZyanU8 *data_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x215,
                  "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                 );
  }
  if (*data == 'b') {
    if ((uint)(instruction->raw).field_3.evex.offset != instruction->length - 4) {
      __assert_fail("instruction->raw.evex.offset == instruction->length - 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x217,
                    "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                   );
    }
    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE) {
      context_local._4_4_ = 0x80200001;
    }
    else {
      instruction->attributes = instruction->attributes | 0x20;
      (instruction->raw).field_3.rex.W = (ZyanU8)((int)(uint)data[1] >> 7);
      (instruction->raw).field_3.rex.R = (byte)((int)(uint)data[1] >> 6) & 1;
      (instruction->raw).field_3.rex.X = (byte)((int)(uint)data[1] >> 5) & 1;
      (instruction->raw).field_3.rex.B = (byte)((int)(uint)data[1] >> 4) & 1;
      if ((data[1] & 8) == 0) {
        (instruction->raw).field_3.rex.offset = data[1] & 7;
        if ((((instruction->raw).field_3.rex.offset == '\0') ||
            ((instruction->raw).field_3.rex.offset == '\x04')) ||
           ((instruction->raw).field_3.rex.offset == '\a')) {
          context_local._4_4_ = 0x80200007;
        }
        else {
          (instruction->raw).field_3.xop.vvvv = (ZyanU8)((int)(uint)data[2] >> 7);
          (instruction->raw).field_3.xop.L = (byte)((int)(uint)data[2] >> 3) & 0xf;
          if (((int)(uint)data[2] >> 2 & 1U) != 1) {
            __assert_fail("((data[2] >> 2) & 0x01) == 0x01",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x238,
                          "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                         );
          }
          (instruction->raw).field_3.xop.pp = data[2] & 3;
          (instruction->raw).field_3.xop.offset = (ZyanU8)((int)(uint)data[3] >> 7);
          (instruction->raw).field_3.vex.size = (byte)((int)(uint)data[3] >> 6) & 1;
          (instruction->raw).field_3.evex.L = (byte)((int)(uint)data[3] >> 5) & 1;
          (instruction->raw).field_3.evex.b = (byte)((int)(uint)data[3] >> 4) & 1;
          (instruction->raw).field_3.evex.V2 = (byte)((int)(uint)data[3] >> 3) & 1;
          if (((instruction->raw).field_3.evex.V2 == '\0') &&
             (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) {
            context_local._4_4_ = 0x80200008;
          }
          else {
            (instruction->raw).field_3.evex.aaa = data[3] & 7;
            if (((instruction->raw).field_3.xop.offset == '\0') ||
               ((instruction->raw).field_3.evex.aaa != '\0')) {
              (context->vector_unified).W = (instruction->raw).field_3.xop.vvvv;
              (context->vector_unified).R = ((instruction->raw).field_3.rex.W ^ 0xff) & 1;
              (context->vector_unified).X = ((instruction->raw).field_3.rex.R ^ 0xff) & 1;
              (context->vector_unified).B = ((instruction->raw).field_3.rex.X ^ 0xff) & 1;
              (context->vector_unified).LL = (byte)((int)(uint)data[3] >> 5) & 3;
              (context->vector_unified).R2 = ((instruction->raw).field_3.rex.B ^ 0xff) & 1;
              (context->vector_unified).V2 = ((instruction->raw).field_3.evex.V2 ^ 0xff) & 1;
              (context->vector_unified).vvvv = ((instruction->raw).field_3.xop.L ^ 0xff) & 0xf;
              (context->vector_unified).mask = (instruction->raw).field_3.evex.aaa;
              if (((instruction->raw).field_3.evex.V2 == '\0') &&
                 (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) {
                context_local._4_4_ = 0x80200008;
              }
              else if (((instruction->raw).field_3.evex.b == '\0') &&
                      ((context->vector_unified).LL == '\x03')) {
                context_local._4_4_ = 0x80200008;
              }
              else {
                context_local._4_4_ = 0x100000;
              }
            }
            else {
              context_local._4_4_ = 0x8020000a;
            }
          }
        }
      }
      else {
        context_local._4_4_ = 0x80200008;
      }
    }
    return context_local._4_4_;
  }
  __assert_fail("data[0] == 0x62",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x216,
                "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
               );
}

Assistant:

static ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZyanU8 data[4])
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(data[0] == 0x62);
    ZYAN_ASSERT(instruction->raw.evex.offset == instruction->length - 4);

    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_REAL_16)
    {
        // EVEX is invalid in 16-bit real mode
        return ZYDIS_STATUS_DECODING_ERROR;
    }

    instruction->attributes |= ZYDIS_ATTRIB_HAS_EVEX;
    instruction->raw.evex.R         = (data[1] >> 7) & 0x01;
    instruction->raw.evex.X         = (data[1] >> 6) & 0x01;
    instruction->raw.evex.B         = (data[1] >> 5) & 0x01;
    instruction->raw.evex.R2        = (data[1] >> 4) & 0x01;

    if (data[1] & 0x08)
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }

    instruction->raw.evex.mmm       = (data[1] >> 0) & 0x07;

    if ((instruction->raw.evex.mmm == 0x00) ||
        (instruction->raw.evex.mmm == 0x04) ||
        (instruction->raw.evex.mmm == 0x07))
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_INVALID_MAP;
    }

    instruction->raw.evex.W         = (data[2] >> 7) & 0x01;
    instruction->raw.evex.vvvv      = (data[2] >> 3) & 0x0F;

    ZYAN_ASSERT(((data[2] >> 2) & 0x01) == 0x01);

    instruction->raw.evex.pp        = (data[2] >> 0) & 0x03;
    instruction->raw.evex.z         = (data[3] >> 7) & 0x01;
    instruction->raw.evex.L2        = (data[3] >> 6) & 0x01;
    instruction->raw.evex.L         = (data[3] >> 5) & 0x01;
    instruction->raw.evex.b         = (data[3] >> 4) & 0x01;
    instruction->raw.evex.V2        = (data[3] >> 3) & 0x01;

    if (!instruction->raw.evex.V2 &&
        (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64))
    {
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }

    instruction->raw.evex.aaa       = (data[3] >> 0) & 0x07;

    if (instruction->raw.evex.z && !instruction->raw.evex.aaa)
    {
        return ZYDIS_STATUS_INVALID_MASK; // TODO: Dedicated status code
    }

    // Update internal fields
    context->vector_unified.W    = instruction->raw.evex.W;
    context->vector_unified.R    = 0x01 & ~instruction->raw.evex.R;
    context->vector_unified.X    = 0x01 & ~instruction->raw.evex.X;
    context->vector_unified.B    = 0x01 & ~instruction->raw.evex.B;
    context->vector_unified.LL   = (data[3] >> 5) & 0x03;
    context->vector_unified.R2   = 0x01 & ~instruction->raw.evex.R2;
    context->vector_unified.V2   = 0x01 & ~instruction->raw.evex.V2;
    context->vector_unified.vvvv = 0x0F & ~instruction->raw.evex.vvvv;
    context->vector_unified.mask = instruction->raw.evex.aaa;

    if (!instruction->raw.evex.V2 && (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64))
    {
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }
    if (!instruction->raw.evex.b && (context->vector_unified.LL == 3))
    {
        // LL = 3 is only valid for instructions with embedded rounding control
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }

    return ZYAN_STATUS_SUCCESS;
}